

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_parallelogram_shared.h
# Opt level: O0

void draco::GetParallelogramEntries<draco::CornerTable>
               (CornerIndex ci,CornerTable *table,
               vector<int,_std::allocator<int>_> *vertex_to_data_map,int *opp_entry,int *next_entry,
               int *prev_entry)

{
  uint uVar1;
  const_reference pvVar2;
  value_type *in_RCX;
  CornerTable *in_RDX;
  uint in_ESI;
  undefined4 in_EDI;
  value_type *in_R8;
  value_type *in_R9;
  CornerTable *in_stack_ffffffffffffff98;
  CornerTable *this;
  CornerIndex in_stack_ffffffffffffffa0;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_48;
  undefined4 local_44;
  uint local_40;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_3c [2];
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_34;
  value_type *local_30;
  value_type *local_28;
  value_type *local_20;
  CornerTable *local_18;
  CornerIndex local_10;
  undefined4 local_4;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_4 = in_EDI;
  local_10.value_ = in_ESI;
  local_34.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_34);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)in_RDX,(ulong)uVar1);
  *local_20 = *pvVar2;
  local_44 = local_4;
  this = local_18;
  local_40 = (uint)CornerTable::Next(local_18,in_stack_ffffffffffffffa0);
  local_3c[0].value_ = (uint)CornerTable::Vertex(this,in_stack_ffffffffffffffa0);
  uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(local_3c);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)this,(ulong)uVar1);
  *local_28 = *pvVar2;
  CornerTable::Previous(this,local_10);
  local_48.value_ = (uint)CornerTable::Vertex(this,local_10);
  uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_48);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_18,(ulong)uVar1);
  *local_30 = *pvVar2;
  return;
}

Assistant:

inline void GetParallelogramEntries(
    const CornerIndex ci, const CornerTableT *table,
    const std::vector<int32_t> &vertex_to_data_map, int *opp_entry,
    int *next_entry, int *prev_entry) {
  // One vertex of the input |table| correspond to exactly one attribute value
  // entry. The |table| can be either CornerTable for per-vertex attributes,
  // or MeshAttributeCornerTable for attributes with interior seams.
  *opp_entry = vertex_to_data_map[table->Vertex(ci).value()];
  *next_entry = vertex_to_data_map[table->Vertex(table->Next(ci)).value()];
  *prev_entry = vertex_to_data_map[table->Vertex(table->Previous(ci)).value()];
}